

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void FreeDeclaredAttributes(TidyDocImpl *doc)

{
  Attribute *pAVar1;
  Attribute *dict;
  TidyAttribImpl *attribs;
  TidyDocImpl *doc_local;
  
  while (pAVar1 = (doc->attribs).declared_attr_list, pAVar1 != (Attribute *)0x0) {
    (doc->attribs).declared_attr_list = pAVar1->next;
    attrsRemoveFromHash(doc,&doc->attribs,pAVar1->name);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar1->name);
    (*doc->allocator->vtbl->free)(doc->allocator,pAVar1);
  }
  return;
}

Assistant:

static void FreeDeclaredAttributes( TidyDocImpl* doc )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Attribute* dict;
    while ( NULL != (dict = attribs->declared_attr_list) )
    {
        attribs->declared_attr_list = dict->next;
        attrsRemoveFromHash( doc, &doc->attribs, dict->name );
        TidyDocFree( doc, dict->name );
        TidyDocFree( doc, dict );
    }
}